

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_x86_fma.cpp
# Opt level: O0

int __thiscall ncnn::Pooling_x86_fma::create_pipeline(Pooling_x86_fma *this,Option *param_1)

{
  Option *param_1_local;
  Pooling_x86_fma *this_local;
  
  if (*(int *)(&this->field_0x100 + (long)this->_vptr_Pooling_x86_fma[-3]) != 0) {
    (&this->field_0xb)[(long)this->_vptr_Pooling_x86_fma[-3]] = 0;
    (&this->field_0xc)[(long)this->_vptr_Pooling_x86_fma[-3]] = 0;
    (&this->field_0xd)[(long)this->_vptr_Pooling_x86_fma[-3]] = 0;
    (&this->field_0xe)[(long)this->_vptr_Pooling_x86_fma[-3]] = 0;
    (&this->field_0x10)[(long)this->_vptr_Pooling_x86_fma[-3]] = 0;
  }
  return 0;
}

Assistant:

int Pooling_x86_fma::create_pipeline(const Option& /*opt*/)
{
    if (adaptive_pooling)
    {
        support_packing = false;

        support_bf16_storage = false;
        support_fp16_storage = false;
        support_int8_storage = false;
        support_tensor_storage = false;
    }
    return 0;
}